

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapping0.c
# Opt level: O2

int mapping0_inverse(vorbis_block *vb,vorbis_info_mapping *l)

{
  float fVar1;
  int iVar2;
  vorbis_look_floor *pvVar3;
  _func_void_ptr_vorbis_block_ptr_vorbis_look_floor_ptr *p_Var4;
  float *pfVar5;
  vorbis_look_residue *pvVar6;
  _func_int_vorbis_block_ptr_vorbis_look_residue_ptr_float_ptr_ptr_int_ptr_int *p_Var7;
  float *pfVar8;
  _func_int_vorbis_block_ptr_vorbis_look_floor_ptr_void_ptr_float_ptr *p_Var9;
  mdct_lookup *init;
  undefined8 uVar10;
  float **ppfVar11;
  vorbis_block *pvVar12;
  ulong uVar13;
  long lVar14;
  void *pvVar15;
  ulong uVar16;
  undefined4 uVar17;
  ulong uVar18;
  long lVar19;
  long lVar20;
  int iVar21;
  vorbis_info *pvVar22;
  int *piVar23;
  float fVar24;
  long lStack_80;
  float *pfStack_78;
  vorbis_info *local_70;
  float **local_68;
  ulong local_60;
  long local_58;
  long local_50;
  void *local_48;
  void *local_40;
  vorbis_block *local_38;
  
  pvVar22 = vb->vd->vi;
  local_40 = vb->vd->backend_state;
  local_48 = pvVar22->codec_setup;
  local_50 = *(long *)((long)pvVar22->codec_setup + vb->W * 8);
  local_38 = vb;
  vb->pcmend = (int)local_50;
  local_50 = local_50 << 0x20;
  uVar13 = (ulong)pvVar22->channels;
  uVar16 = uVar13 * 8 + 0xf & 0xfffffffffffffff0;
  local_68 = (float **)((long)&pfStack_78 - uVar16);
  uVar18 = uVar13 * 4 + 0xf & 0xfffffffffffffff0;
  piVar23 = (int *)((long)local_68 - uVar18);
  lVar19 = (long)piVar23 + (-uVar16 - uVar18);
  local_58 = lVar19;
  local_60 = (ulong)(local_50 >> 0x1e) >> 1;
  local_70 = pvVar22;
  for (lVar20 = 0; pvVar12 = local_38, lVar20 < (int)uVar13; lVar20 = lVar20 + 1) {
    lVar14 = (long)*(int *)((long)l + (long)*(int *)((long)l + lVar20 * 4 + 4) * 4 + 0x404);
    pvVar3 = *(vorbis_look_floor **)(*(long *)((long)local_40 + 0x58) + lVar14 * 8);
    p_Var4 = _floor_P[*(int *)((long)local_48 + lVar14 * 4 + 0x528)]->inverse1;
    *(undefined8 *)(lVar19 + -8) = 0x1c32af;
    pvVar15 = (*p_Var4)(pvVar12,pvVar3);
    *(void **)(local_58 + lVar20 * 8) = pvVar15;
    *(uint *)((long)piVar23 + (lVar20 * 4 - uVar18)) = (uint)(pvVar15 != (void *)0x0);
    uVar13 = local_60;
    pvVar22 = local_70;
    pfVar5 = pvVar12->pcm[lVar20];
    *(undefined8 *)(lVar19 + -8) = 0x1c32da;
    memset(pfVar5,0,uVar13);
    uVar13 = (ulong)(uint)pvVar22->channels;
  }
  uVar16 = 0;
  uVar13 = (ulong)*(uint *)((long)l + 0x484);
  if ((int)*(uint *)((long)l + 0x484) < 1) {
    uVar13 = uVar16;
  }
  *(undefined8 *)(lVar19 + -8) = 1;
  uVar10 = *(undefined8 *)(lVar19 + -8);
  for (; uVar13 != uVar16; uVar16 = uVar16 + 1) {
    lVar20 = (long)*(int *)((long)l + uVar16 * 4 + 0x488);
    lVar14 = (long)*(int *)((long)l + uVar16 * 4 + 0x888);
    if ((*(int *)((long)piVar23 + (lVar20 * 4 - uVar18)) != 0) ||
       (*(int *)((long)piVar23 + (lVar14 * 4 - uVar18)) != 0)) {
      uVar17 = (undefined4)uVar10;
      *(undefined4 *)((long)piVar23 + (lVar20 * 4 - uVar18)) = uVar17;
      *(undefined4 *)((long)piVar23 + (lVar14 * 4 - uVar18)) = uVar17;
    }
  }
  local_50 = local_50 >> 0x20;
  for (uVar13 = 0; pvVar12 = local_38, ppfVar11 = local_68, (long)uVar13 < (long)*l;
      uVar13 = uVar13 + 1) {
    iVar2 = pvVar22->channels;
    iVar21 = 0;
    for (lVar20 = 0; lVar20 < iVar2; lVar20 = lVar20 + 1) {
      if (uVar13 == *(uint *)((long)l + lVar20 * 4 + 4)) {
        piVar23[iVar21] = (uint)(*(int *)((long)piVar23 + (lVar20 * 4 - uVar18)) != 0);
        ppfVar11[iVar21] = pvVar12->pcm[lVar20];
        iVar21 = iVar21 + 1;
      }
    }
    lVar20 = (long)*(int *)((long)l + uVar13 * 4 + 0x444);
    pvVar6 = *(vorbis_look_residue **)(*(long *)((long)local_40 + 0x60) + lVar20 * 8);
    p_Var7 = _residue_P[*(int *)((long)local_48 + lVar20 * 4 + 0x828)]->inverse;
    *(undefined8 *)(lVar19 + -8) = 0x1c33b2;
    (*p_Var7)(pvVar12,pvVar6,ppfVar11,piVar23,iVar21);
  }
  uVar13 = (ulong)*(uint *)((long)l + 0x484);
  *(undefined8 *)(lVar19 + -8) = 2;
  lVar20 = local_50 / *(long *)(lVar19 + -8);
  if (lVar20 < 1) {
    lVar20 = 0;
  }
  do {
    if ((int)uVar13 < 1) {
      for (lVar20 = 0; pvVar12 = local_38, uVar13 = (ulong)pvVar22->channels, lVar20 < (long)uVar13;
          lVar20 = lVar20 + 1) {
        pfVar5 = local_38->pcm[lVar20];
        lVar14 = (long)*(int *)((long)l + (long)*(int *)((long)l + lVar20 * 4 + 4) * 4 + 0x404);
        pvVar3 = *(vorbis_look_floor **)(*(long *)((long)local_40 + 0x58) + lVar14 * 8);
        pvVar15 = *(void **)(local_58 + lVar20 * 8);
        p_Var9 = _floor_P[*(int *)((long)local_48 + lVar14 * 4 + 0x528)]->inverse2;
        *(undefined8 *)(lVar19 + -8) = 0x1c34aa;
        (*p_Var9)(pvVar12,pvVar3,pvVar15,pfVar5);
      }
      for (lVar20 = 0; lVar20 < (int)uVar13; lVar20 = lVar20 + 1) {
        pfVar5 = local_38->pcm[lVar20];
        init = (mdct_lookup *)**(undefined8 **)((long)local_40 + local_38->W * 8 + 0x10);
        *(undefined8 *)(lVar19 + -8) = 0x1c34db;
        mdct_backward(init,pfVar5,pfVar5);
        uVar13 = (ulong)(uint)pvVar22->channels;
      }
      return 0;
    }
    uVar13 = uVar13 - 1;
    pfVar5 = local_38->pcm[*(int *)((long)l + uVar13 * 4 + 0x488)];
    pfVar8 = local_38->pcm[*(int *)((long)l + uVar13 * 4 + 0x888)];
    for (lVar14 = 0; lVar20 != lVar14; lVar14 = lVar14 + 1) {
      fVar24 = pfVar5[lVar14];
      fVar1 = pfVar8[lVar14];
      if (fVar24 <= 0.0) {
        if (0.0 < fVar1) {
          fVar24 = fVar24 + fVar1;
          goto LAB_001c342c;
        }
        pfVar8[lVar14] = fVar24;
        pfVar5[lVar14] = fVar24 - fVar1;
      }
      else if (fVar1 <= 0.0) {
        pfVar8[lVar14] = fVar24;
        pfVar5[lVar14] = fVar1 + fVar24;
      }
      else {
        fVar24 = fVar24 - fVar1;
LAB_001c342c:
        pfVar8[lVar14] = fVar24;
      }
    }
  } while( true );
}

Assistant:

static int mapping0_inverse(vorbis_block *vb,vorbis_info_mapping *l){
  vorbis_dsp_state     *vd=vb->vd;
  vorbis_info          *vi=vd->vi;
  codec_setup_info     *ci=vi->codec_setup;
  private_state        *b=vd->backend_state;
  vorbis_info_mapping0 *info=(vorbis_info_mapping0 *)l;

  int                   i,j;
  long                  n=vb->pcmend=ci->blocksizes[vb->W];

  float **pcmbundle=alloca(sizeof(*pcmbundle)*vi->channels);
  int    *zerobundle=alloca(sizeof(*zerobundle)*vi->channels);

  int   *nonzero  =alloca(sizeof(*nonzero)*vi->channels);
  void **floormemo=alloca(sizeof(*floormemo)*vi->channels);

  /* recover the spectral envelope; store it in the PCM vector for now */
  for(i=0;i<vi->channels;i++){
    int submap=info->chmuxlist[i];
    floormemo[i]=_floor_P[ci->floor_type[info->floorsubmap[submap]]]->
      inverse1(vb,b->flr[info->floorsubmap[submap]]);
    if(floormemo[i])
      nonzero[i]=1;
    else
      nonzero[i]=0;
    memset(vb->pcm[i],0,sizeof(*vb->pcm[i])*n/2);
  }

  /* channel coupling can 'dirty' the nonzero listing */
  for(i=0;i<info->coupling_steps;i++){
    if(nonzero[info->coupling_mag[i]] ||
       nonzero[info->coupling_ang[i]]){
      nonzero[info->coupling_mag[i]]=1;
      nonzero[info->coupling_ang[i]]=1;
    }
  }

  /* recover the residue into our working vectors */
  for(i=0;i<info->submaps;i++){
    int ch_in_bundle=0;
    for(j=0;j<vi->channels;j++){
      if(info->chmuxlist[j]==i){
        if(nonzero[j])
          zerobundle[ch_in_bundle]=1;
        else
          zerobundle[ch_in_bundle]=0;
        pcmbundle[ch_in_bundle++]=vb->pcm[j];
      }
    }

    _residue_P[ci->residue_type[info->residuesubmap[i]]]->
      inverse(vb,b->residue[info->residuesubmap[i]],
              pcmbundle,zerobundle,ch_in_bundle);
  }

  /* channel coupling */
  for(i=info->coupling_steps-1;i>=0;i--){
    float *pcmM=vb->pcm[info->coupling_mag[i]];
    float *pcmA=vb->pcm[info->coupling_ang[i]];

    for(j=0;j<n/2;j++){
      float mag=pcmM[j];
      float ang=pcmA[j];

      if(mag>0)
        if(ang>0){
          pcmM[j]=mag;
          pcmA[j]=mag-ang;
        }else{
          pcmA[j]=mag;
          pcmM[j]=mag+ang;
        }
      else
        if(ang>0){
          pcmM[j]=mag;
          pcmA[j]=mag+ang;
        }else{
          pcmA[j]=mag;
          pcmM[j]=mag-ang;
        }
    }
  }

  /* compute and apply spectral envelope */
  for(i=0;i<vi->channels;i++){
    float *pcm=vb->pcm[i];
    int submap=info->chmuxlist[i];
    _floor_P[ci->floor_type[info->floorsubmap[submap]]]->
      inverse2(vb,b->flr[info->floorsubmap[submap]],
               floormemo[i],pcm);
  }

  /* transform the PCM data; takes PCM vector, vb; modifies PCM vector */
  /* only MDCT right now.... */
  for(i=0;i<vi->channels;i++){
    float *pcm=vb->pcm[i];
    mdct_backward(b->transform[vb->W][0],pcm,pcm);
  }

  /* all done! */
  return(0);
}